

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939cat.c
# Opt level: O1

int main(int argc,char **argv)

{
  size_t __size;
  int iVar1;
  int iVar2;
  uint uVar3;
  j1939cat_priv *priv;
  ulong uVar4;
  uint8_t *buf;
  int *piVar5;
  __off_t _Var6;
  size_t buf_size;
  undefined4 uVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  size_t _min2;
  ulong uVar11;
  void *pvVar12;
  void *buf_00;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  uint sock_opt;
  uint events;
  size_t _min1;
  int *local_a0;
  pollfd local_98;
  j1939cat_priv *local_90;
  sockaddr_can *local_88;
  int local_7c;
  sockaddr_can *local_78;
  int local_6c;
  ulong local_68;
  ulong local_60;
  void *local_58;
  size_t local_50;
  size_t local_48;
  ulong local_40;
  undefined4 local_34;
  
  priv = (j1939cat_priv *)calloc(1,0xb0);
  if (priv == (j1939cat_priv *)0x0) {
    pcVar10 = "can\'t allocate priv";
LAB_00102d1c:
    err(1,pcVar10);
  }
  piVar5 = &priv->todo_prio;
  priv->todo_prio = -1;
  priv->infile = 0;
  priv->outfile = 1;
  priv->max_transfer = 0x6fffff9;
  priv->polltimeout = 100000;
  priv->repeat = 1;
  local_88 = &priv->sockname;
  (priv->sockname).can_family = 0x1d;
  (priv->sockname).can_addr.j1939.addr = 0xff;
  (priv->sockname).can_addr.j1939.name = 0;
  (priv->sockname).can_addr.j1939.pgn = 0x40000;
  local_78 = &priv->peername;
  (priv->peername).can_family = 0x1d;
  (priv->peername).can_addr.j1939.addr = 0xff;
  (priv->peername).can_addr.j1939.name = 0;
  (priv->peername).can_addr.j1939.pgn = 0x40000;
  local_a0 = &priv->todo_broadcast;
  local_90 = priv;
LAB_00102536:
  while (iVar1 = getopt(argc,argv,"?hi:vs:rp:P:R:B"), 0x68 < iVar1) {
    if (iVar1 < 0x72) {
      if (iVar1 == 0x69) {
        iVar1 = open(_optarg,0);
        priv->infile = iVar1;
        if (iVar1 == -1) {
          pcVar10 = "can\'t open input file";
          goto LAB_00102d1c;
        }
        priv->todo_filesize = true;
      }
      else {
        if (iVar1 != 0x70) goto LAB_00102807;
        uVar4 = strtoul(_optarg,(char **)0x0,0);
        *piVar5 = (int)uVar4;
      }
    }
    else if (iVar1 == 0x72) {
      priv->todo_recv = true;
    }
    else {
      if (iVar1 != 0x73) goto LAB_00102807;
      uVar4 = strtoul(_optarg,(char **)0x0,0);
      priv->max_transfer = uVar4;
      if (0x6fffff9 < uVar4) {
        err(1,"used value (%zu) is bigger then allowed maximal size: %u.\n",uVar4,0x6fffff9);
      }
    }
  }
  if (iVar1 < 0x52) {
    if (iVar1 == 0x42) {
      *local_a0 = 1;
      goto LAB_00102536;
    }
    if (iVar1 == 0x50) {
      uVar4 = strtoul(_optarg,(char **)0x0,0);
      priv->polltimeout = uVar4;
      goto LAB_00102536;
    }
    if (iVar1 != -1) goto LAB_00102807;
    pcVar10 = argv[_optind];
    if (pcVar10 != (char *)0x0) {
      iVar1 = strcmp("-",pcVar10);
      if (iVar1 != 0) {
        libj1939_parse_canaddr(pcVar10,local_88);
      }
      _optind = _optind + 1;
    }
    pcVar10 = argv[_optind];
    bVar13 = true;
    if (pcVar10 != (char *)0x0) {
      iVar1 = strcmp("-",pcVar10);
      if (iVar1 != 0) {
        libj1939_parse_canaddr(pcVar10,local_78);
        local_90->valid_peername = true;
      }
      _optind = _optind + 1;
    }
    iVar1 = 0;
    priv = local_90;
  }
  else {
    if (iVar1 == 0x52) {
      uVar4 = strtoul(_optarg,(char **)0x0,0);
      priv->repeat = uVar4;
      if (uVar4 == 0) {
        pcVar10 = "send/repeat count can\'t be less then 1\n";
        goto LAB_00102d1c;
      }
      goto LAB_00102536;
    }
    if (iVar1 == 99) {
      priv->todo_connect = true;
      goto LAB_00102536;
    }
LAB_00102807:
    main_cold_1();
    iVar1 = 1;
    bVar13 = false;
  }
  if (!bVar13) {
    return iVar1;
  }
  iVar1 = socket(0x1d,2,7);
  priv->sock = iVar1;
  if (iVar1 < 0) {
    pcVar10 = "socket(j1939)";
    goto LAB_0010283b;
  }
  if ((*piVar5 < 0) || (iVar1 = setsockopt(iVar1,0x6b,3,piVar5,4), -1 < iVar1)) {
    local_34 = 1;
    iVar1 = setsockopt(priv->sock,0x6b,4,&local_34,4);
    if (iVar1 < 0) {
      pcVar10 = "set recverr";
      goto LAB_0010283b;
    }
    local_98.fd = 0x1f98;
    iVar1 = setsockopt(priv->sock,1,0x25,&local_98,4);
    if (iVar1 != 0) {
      pcVar10 = "setsockopt timestamping";
      goto LAB_00102d1c;
    }
    if (*local_a0 == 0) {
LAB_00102796:
      iVar1 = bind(priv->sock,(sockaddr *)local_88,0x18);
      if (iVar1 < 0) {
        pcVar10 = "bind()";
      }
      else {
        iVar1 = 0;
        bVar13 = true;
        if (priv->todo_connect != true) goto LAB_0010284a;
        if (priv->valid_peername == false) {
          pcVar10 = "no peername supplied";
        }
        else {
          iVar2 = connect(priv->sock,(sockaddr *)local_78,0x18);
          if (-1 < iVar2) goto LAB_0010284a;
          pcVar10 = "connect()";
        }
      }
LAB_0010283b:
      warn(pcVar10);
      goto LAB_00102844;
    }
    iVar1 = 1;
    iVar2 = setsockopt(priv->sock,1,6,local_a0,4);
    if (-1 < iVar2) goto LAB_00102796;
    bVar13 = false;
    warn("setsockopt: filed to set broadcast");
  }
  else {
    warn("set priority %i");
LAB_00102844:
    bVar13 = false;
    iVar1 = 1;
  }
LAB_0010284a:
  if (!bVar13) {
    return iVar1;
  }
  if (priv->todo_recv == true) {
    __size = priv->max_transfer;
    buf = (uint8_t *)malloc(__size);
    if (buf != (uint8_t *)0x0) {
      priv->last_dpo = -1;
      goto LAB_00102884;
    }
    warn("can\'t allocate rx buf");
  }
  else {
    uVar4 = 0;
    if (priv->todo_filesize == true) {
      iVar1 = priv->infile;
      uVar4 = lseek(iVar1,0,2);
      if (uVar4 == 0xffffffffffffffff) {
        pcVar10 = "%s lseek()\n";
      }
      else {
        _Var6 = lseek(iVar1,0,0);
        if (_Var6 != -1) goto LAB_001029ad;
        pcVar10 = "%s lseek() start\n";
      }
      pcVar8 = "j1939cat_get_file_size";
      goto LAB_00102d5a;
    }
LAB_001029ad:
    if ((int)uVar4 != 0) {
      if (priv->repeat == 0) goto LAB_00102cc6;
      local_68 = uVar4 & 0xffffffff;
      uVar4 = 0;
      goto LAB_001029cb;
    }
  }
  iVar1 = 1;
  goto LAB_00102cec;
LAB_001029cb:
  do {
    uVar11 = local_68;
    priv->round = priv->round + 1;
    local_7c = priv->sock;
    local_6c = priv->infile;
    local_50 = priv->max_transfer;
    if (local_68 <= priv->max_transfer) {
      local_50 = local_68;
    }
    local_60 = uVar4;
    local_58 = malloc(local_50);
    if (local_58 == (void *)0x0) {
      warn("can\'t allocate buf");
      iVar1 = 1;
    }
    else {
      do {
        buf_00 = local_58;
        uVar4 = uVar11;
        if (local_50 < uVar11) {
          uVar4 = local_50;
        }
        buf_size = read(local_6c,local_58,uVar4);
        if (buf_size == 0xffffffffffffffff) {
          iVar1 = 1;
          goto LAB_00102c92;
        }
        if (buf_size == 0) break;
        local_78 = (sockaddr_can *)((long)buf_00 + buf_size);
        local_88 = (sockaddr_can *)CONCAT44(local_88._4_4_,0xc);
        bVar13 = false;
        local_48 = buf_size;
        local_40 = uVar11;
        do {
          sVar9 = buf_size;
          pvVar12 = buf_00;
          if (priv->polltimeout == 0) {
            uVar4 = j1939cat_send_one(priv,local_7c,buf_00,buf_size);
            if (-1 < (long)uVar4) goto LAB_00102bad;
            bVar14 = true;
            local_a0 = (int *)(uVar4 & 0xffffffff);
          }
          else {
            local_98.fd = priv->sock;
            local_98.revents = 0;
            local_98.events = (ushort)local_88;
            iVar1 = poll(&local_98,1,(int)priv->polltimeout);
            bVar14 = true;
            if (iVar1 == 0) {
              local_a0 = (int *)0xffffffc2;
LAB_00102ba7:
              uVar4 = 0;
              bVar15 = false;
            }
            else {
              if (iVar1 == -1) {
                piVar5 = __errno_location();
                bVar14 = *piVar5 != -4;
                if (bVar14) {
                  local_a0._0_4_ = -*piVar5;
                }
                local_a0 = (int *)(ulong)(uint)local_a0;
                goto LAB_00102ba7;
              }
              if (((uint)local_88 & (int)local_98.revents) == 0) {
                warn("%s: something else is wrong %x %x");
                local_a0 = (int *)0xfffffffb;
                goto LAB_00102ba7;
              }
              if (((int)local_98.revents & 8U) != 0) {
                uVar3 = j1939cat_recv_err(priv);
                if (uVar3 == 0xfffffffc) {
                  bVar14 = false;
                }
                else {
                  if (uVar3 == 0) {
                    if (priv->repeat - 1 == (ulong)(priv->stats).tskey) {
                      bVar13 = true;
                    }
                    goto LAB_00102b42;
                  }
                  local_a0 = (int *)(ulong)uVar3;
                }
                goto LAB_00102ba7;
              }
LAB_00102b42:
              uVar4 = 0;
              bVar15 = true;
              if (((local_98._4_4_ & 0x40000) == 0) ||
                 (uVar4 = j1939cat_send_one(local_90,local_7c,buf_00,buf_size), -1 < (long)uVar4)) {
                bVar14 = false;
              }
              else {
                bVar15 = false;
                local_a0 = (int *)(uVar4 & 0xffffffff);
              }
            }
            priv = local_90;
            if (bVar15) {
LAB_00102bad:
              sVar9 = buf_size - uVar4;
              pvVar12 = (void *)(uVar4 + (long)buf_00);
              if (local_78 < (sockaddr_can *)((long)buf_00 + buf_size)) {
                warn("%s: send buffer is bigger than the read buffer");
                bVar14 = true;
                local_a0 = (int *)0xffffffea;
                priv = local_90;
              }
              else {
                bVar14 = false;
                priv = local_90;
                if (sVar9 == 0) {
                  bVar15 = local_90->repeat == local_90->round;
                  uVar7 = (uint)local_88;
                  if (bVar15) {
                    uVar7 = 8;
                  }
                  local_88 = (sockaddr_can *)CONCAT44(local_88._4_4_,uVar7);
                  if (!bVar15) {
                    bVar13 = true;
                  }
                }
              }
            }
          }
          if (bVar14) {
            iVar1 = (uint)local_a0;
            goto LAB_00102c54;
          }
          buf_size = sVar9;
          buf_00 = pvVar12;
        } while (!bVar13);
        iVar1 = 0;
LAB_00102c54:
        buf_00 = local_58;
        if (iVar1 != 0) goto LAB_00102c92;
        uVar11 = local_40 - local_48;
      } while (uVar11 != 0);
      iVar1 = 0;
LAB_00102c92:
      free(buf_00);
    }
    if (iVar1 != 0) goto LAB_00102cec;
    _Var6 = lseek(priv->infile,0,0);
    if (_Var6 == -1) {
      pcVar10 = "%s lseek() start\n";
      pcVar8 = "j1939cat_send";
LAB_00102d5a:
      err(1,pcVar10,pcVar8);
    }
    uVar4 = (ulong)((int)local_60 + 1);
  } while (uVar4 < priv->repeat);
LAB_00102cc6:
  iVar1 = 0;
  goto LAB_00102cec;
LAB_00102884:
  do {
    if (priv->polltimeout == 0) {
      iVar2 = j1939cat_recv_one(priv,buf,__size);
      if (iVar2 != 0) goto LAB_00102ce4;
    }
    else {
      local_98.fd = priv->sock;
      local_98.events = 9;
      local_98.revents = 0;
      iVar2 = poll(&local_98,1,(int)priv->polltimeout);
      bVar13 = false;
      if (iVar2 != 0) {
        if (iVar2 == -1) {
          piVar5 = __errno_location();
          bVar13 = *piVar5 != -4;
          if (bVar13) {
            iVar1 = -*piVar5;
          }
        }
        else if (((int)local_98.revents & 9U) == 0) {
          warn("%s: something else is wrong %x %x","j1939cat_recv",(int)local_98.revents,9);
          bVar13 = true;
          iVar1 = -5;
        }
        else if ((local_98._4_4_ & 0x80000) == 0) {
LAB_0010290d:
          bVar13 = false;
          if ((local_98._4_4_ & 0x10000) != 0) {
            j1939cat_recv_one(priv,buf,__size);
          }
        }
        else {
          iVar2 = j1939cat_recv_err(priv);
          if (iVar2 != -4) {
            if (iVar2 == 0) goto LAB_0010290d;
            bVar13 = true;
            iVar1 = iVar2;
          }
        }
      }
      if (bVar13) goto LAB_00102cec;
    }
  } while (priv->todo_recv != false);
  iVar2 = 0;
LAB_00102ce4:
  iVar1 = iVar2;
  free(buf);
LAB_00102cec:
  close(priv->infile);
  close(priv->outfile);
  close(priv->sock);
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
	struct j1939cat_priv *priv;
	int ret = 0;

	priv = calloc(1, sizeof(*priv));
	if (!priv)
		err(EXIT_FAILURE, "can't allocate priv");

	priv->todo_prio = -1;
	priv->infile = STDIN_FILENO;
	priv->outfile = STDOUT_FILENO;
	priv->max_transfer = J1939_MAX_ETP_PACKET_SIZE;
	priv->polltimeout = 100000;
	priv->repeat = 1;

	j1939cat_init_sockaddr_can(&priv->sockname);
	j1939cat_init_sockaddr_can(&priv->peername);

	ret = j1939cat_parse_args(priv, argc, argv);
	if (ret)
		return ret;

	ret = j1939cat_sock_prepare(priv);
	if (ret)
		return ret;

	if (priv->todo_recv)
		ret = j1939cat_recv(priv);
	else
		ret = j1939cat_send(priv);

	close(priv->infile);
	close(priv->outfile);
	close(priv->sock);

	return ret;
}